

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O1

void __thiscall
QHttpNetworkRequest::QHttpNetworkRequest
          (QHttpNetworkRequest *this,QUrl *url,Operation operation,Priority priority)

{
  QHttpNetworkRequestPrivate *this_00;
  
  (this->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader =
       (_func_int **)&PTR__QHttpNetworkRequest_002d3d50;
  this_00 = (QHttpNetworkRequestPrivate *)operator_new(0xd0);
  QHttpNetworkHeaderPrivate::QHttpNetworkHeaderPrivate((QHttpNetworkHeaderPrivate *)this_00,url);
  this_00->operation = operation;
  (this_00->customVerb).d.d = (Data *)0x0;
  (this_00->customVerb).d.ptr = (char *)0x0;
  (this_00->customVerb).d.size = 0;
  (this_00->fullLocalServerName).d.d = (Data *)0x0;
  (this_00->fullLocalServerName).d.ptr = (char16_t *)0x0;
  (this_00->fullLocalServerName).d.size = 0;
  this_00->priority = priority;
  this_00->uploadByteDevice = (QNonContiguousByteDevice *)0x0;
  this_00->autoDecompress = false;
  this_00->pipeliningAllowed = false;
  this_00->http2Allowed = true;
  this_00->http2Direct = false;
  this_00->h2cAllowed = false;
  this_00->withCredentials = true;
  this_00->ssl = false;
  this_00->preConnect = false;
  this_00->needResendWithCredentials = false;
  this_00->redirectCount = 0;
  this_00->redirectPolicy = ManualRedirectPolicy;
  (this_00->peerVerifyName).d.d = (Data *)0x0;
  (this_00->peerVerifyName).d.ptr = (char16_t *)0x0;
  (this_00->peerVerifyName).d.size = 0;
  (this->d).d.ptr = this_00;
  LOCK();
  (this_00->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
  super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_00->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + 1);
  UNLOCK();
  return;
}

Assistant:

QHttpNetworkRequest::QHttpNetworkRequest(const QUrl &url, Operation operation, Priority priority)
    : d(new QHttpNetworkRequestPrivate(operation, priority, url))
{
}